

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O2

void duckdb::ParquetMultiFileInfo::BindReader
               (ClientContext *context,vector<duckdb::LogicalType,_true> *return_types,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *names,MultiFileBindData *bind_data)

{
  MultiFileReaderBindData *pMVar1;
  MultiFileOptions *pMVar2;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> uVar3;
  byte bVar4;
  pointer pTVar5;
  reference pvVar6;
  vector<duckdb::MultiFileColumnDefinition,_true> *this;
  idx_t iVar7;
  pointer pMVar8;
  type pMVar9;
  BinderException *pBVar10;
  idx_t i;
  ulong __n;
  pointer *this_00;
  allocator local_18d;
  undefined4 local_18c;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_188;
  MultiFileBindData *local_180;
  vector<duckdb::LogicalType,_true> schema_col_types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  schema_col_names;
  Value local_120;
  MultiFileColumnDefinition res;
  LogicalType local_48;
  
  pTVar5 = unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
           ::operator->(&bind_data->bind_data);
  if ((_func_int **)
      pTVar5[2].column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage == pTVar5[3].super_FunctionData._vptr_FunctionData)
  {
    pMVar8 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
             ::operator->(&bind_data->multi_file_reader);
    pMVar9 = shared_ptr<duckdb::MultiFileList,_true>::operator*(&bind_data->file_list);
    MultiFileReader::BindReader<duckdb::ParquetMultiFileInfo,duckdb::ParquetOptions>
              ((MultiFileReaderBindData *)&res,pMVar8,context,return_types,names,pMVar9,bind_data,
               (ParquetOptions *)
               &pTVar5[1].column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&bind_data->file_options);
    MultiFileReaderBindData::operator=(&bind_data->reader_bind,(MultiFileReaderBindData *)&res);
    MultiFileReaderBindData::~MultiFileReaderBindData((MultiFileReaderBindData *)&res);
  }
  else {
    local_188 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names;
    pTVar5 = unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
             ::operator->(&bind_data->bind_data);
    if (((bind_data->file_options).union_by_name != false) ||
       ((bind_data->file_options).hive_partitioning == true)) {
      pBVar10 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&res,
                 "Parquet schema cannot be combined with union_by_name=true or hive_partitioning=true"
                 ,(allocator *)&local_120);
      BinderException::BinderException(pBVar10,&res.name);
      __cxa_throw(pBVar10,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    schema_col_names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    schema_col_names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    schema_col_names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    schema_col_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    schema_col_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    schema_col_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_180 = bind_data;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&schema_col_names,
              ((long)pTVar5[3].super_FunctionData._vptr_FunctionData -
              (long)pTVar5[2].column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>
                    .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) / 0xc0);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::reserve
              (&schema_col_types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               ((long)pTVar5[3].super_FunctionData._vptr_FunctionData -
               (long)pTVar5[2].column_ids.
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage) / 0xc0);
    this_00 = &pTVar5[2].column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    if ((_func_int **)
        pTVar5[2].column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage == pTVar5[3].super_FunctionData._vptr_FunctionData
       ) {
      local_18c = 0;
    }
    else {
      pvVar6 = vector<duckdb::ParquetColumnDefinition,_true>::get<true>
                         ((vector<duckdb::ParquetColumnDefinition,_true> *)this_00,0);
      local_18c = (undefined4)
                  CONCAT71((int7)((ulong)pvVar6 >> 8),(pvVar6->identifier).type_.id_ == INTEGER);
    }
    pMVar2 = &local_180->file_options;
    pMVar1 = &local_180->reader_bind;
    this = &(local_180->reader_bind).schema;
    for (__n = 0; __n < (ulong)(((long)pTVar5[3].super_FunctionData._vptr_FunctionData -
                                (long)pTVar5[2].column_ids.
                                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) / 0xc0);
        __n = __n + 1) {
      pvVar6 = vector<duckdb::ParquetColumnDefinition,_true>::get<true>
                         ((vector<duckdb::ParquetColumnDefinition,_true> *)this_00,__n);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&schema_col_names,&pvVar6->name);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&schema_col_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 &pvVar6->type);
      MultiFileColumnDefinition::MultiFileColumnDefinition(&res,&pvVar6->name,&pvVar6->type);
      Value::operator=(&res.identifier,&pvVar6->identifier);
      make_uniq<duckdb::ConstantExpression,duckdb::Value_const&>
                ((duckdb *)&local_120,&pvVar6->default_value);
      uVar3 = res.default_expression;
      res.default_expression.
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           local_120.type_._0_8_;
      local_120.type_._0_8_ = (ParsedExpression *)0x0;
      if (uVar3.
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)uVar3.
                              super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                              .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl
                    + 8))();
        if ((ParsedExpression *)local_120.type_._0_8_ != (ParsedExpression *)0x0) {
          (**(code **)(*(long *)local_120.type_._0_8_ + 8))();
        }
      }
      ::std::
      vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
      ::emplace_back<duckdb::MultiFileColumnDefinition>
                (&this->
                  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                 ,&res);
      MultiFileColumnDefinition::~MultiFileColumnDefinition(&res);
    }
    bVar4 = *(byte *)((long)&pTVar5[1].column_ids.
                             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    if (bVar4 == 1) {
      ::std::__cxx11::string::string((string *)&res,"file_row_number",(allocator *)&local_120);
      iVar7 = StringUtil::CIFind((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                  *)local_188,&res.name);
      ::std::__cxx11::string::~string((string *)&res);
      if (iVar7 != 0xffffffffffffffff) {
        pBVar10 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&res,
                   "Using file_row_number option on file with column named file_row_number is not supported"
                   ,(allocator *)&local_120);
        BinderException::BinderException(pBVar10,&res.name);
        __cxa_throw(pBVar10,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalTypeId_const&>
                ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
                 &LogicalType::BIGINT);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[16]>(local_188,(char (*) [16])"file_row_number");
      bVar4 = *(byte *)((long)&pTVar5[1].column_ids.
                               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    if ((bVar4 & 1) != 0) {
      ::std::__cxx11::string::string((string *)&local_120,"file_row_number",&local_18d);
      LogicalType::LogicalType(&local_48,BIGINT);
      MultiFileColumnDefinition::MultiFileColumnDefinition(&res,(string *)&local_120,&local_48);
      LogicalType::~LogicalType(&local_48);
      ::std::__cxx11::string::~string((string *)&local_120);
      Value::INTEGER(&local_120,0x7ffffffd);
      Value::operator=(&res.identifier,&local_120);
      Value::~Value(&local_120);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&schema_col_names,&res.name);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&schema_col_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,&res.type)
      ;
      ::std::
      vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
      ::emplace_back<duckdb::MultiFileColumnDefinition>
                (&this->
                  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                 ,&res);
      MultiFileColumnDefinition::~MultiFileColumnDefinition(&res);
    }
    (local_180->reader_bind).mapping = (MultiFileColumnMappingMode)local_18c;
    pMVar8 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
             ::operator->(&local_180->multi_file_reader);
    pMVar9 = shared_ptr<duckdb::MultiFileList,_true>::operator*(&local_180->file_list);
    (*pMVar8->_vptr_MultiFileReader[8])
              (pMVar8,pMVar2,pMVar9,&schema_col_types,&schema_col_names,pMVar1);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_188,
                &schema_col_names.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              (&return_types->
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &schema_col_types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&schema_col_types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&schema_col_names);
  }
  return;
}

Assistant:

void ParquetMultiFileInfo::BindReader(ClientContext &context, vector<LogicalType> &return_types, vector<string> &names,
                                      MultiFileBindData &bind_data) {
	auto &parquet_bind = bind_data.bind_data->Cast<ParquetReadBindData>();
	auto &options = parquet_bind.parquet_options;
	if (!options.schema.empty()) {
		BindSchema(context, return_types, names, bind_data);
	} else {
		bind_data.reader_bind = bind_data.multi_file_reader->BindReader<ParquetMultiFileInfo>(
		    context, return_types, names, *bind_data.file_list, bind_data, options, bind_data.file_options);
	}
}